

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::CreateSkeleton(TPZMHMixedMeshControl *this)

{
  long lVar1;
  TPZGeoEl *this_00;
  bool bVar2;
  TPZCompMesh *pTVar3;
  iterator ellist;
  pointer ppVar4;
  TPZGeoMesh *pTVar5;
  TPZGeoEl **ppTVar6;
  pointer ppVar7;
  pointer pTVar8;
  TPZCompEl *pTVar9;
  long in_RDI;
  TPZInterpolatedElement *intelsub;
  iterator its;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *lst;
  iterator itlist;
  TPZInterpolatedElement *intel_1;
  TPZCompEl *cel_1;
  int side;
  TPZGeoEl *gel_1;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  subels;
  int64_t elindex_1;
  TPZInterpolationSpace *intel;
  int Side;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  int64_t elindex;
  iterator it;
  int order;
  int meshdim;
  size_t in_stack_00000278;
  char *in_stack_00000280;
  TPZGeoEl *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  TPZGeoEl *in_stack_fffffffffffffe68;
  TPZCompMesh *in_stack_fffffffffffffe70;
  int64_t in_stack_fffffffffffffe78;
  TPZChunkVector<TPZGeoEl_*,_10> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  TPZCompEl *in_stack_fffffffffffffe98;
  TPZMHMeshControl *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb8;
  int dimension;
  TPZCreateApproximationSpace *in_stack_fffffffffffffec0;
  long *local_130;
  _Self local_f0;
  _Self local_e8;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *local_e0;
  _Self local_d8;
  _Self local_d0;
  int64_t local_c8;
  TPZChunkVector<TPZGeoEl_*,_10> *local_c0;
  int local_b4;
  TPZGeoEl *local_b0;
  long local_68;
  _Self local_60;
  _Self in_stack_ffffffffffffffb0;
  long *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  _Self local_20;
  _Self local_18;
  int local_10;
  int local_c;
  
  dimension = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  local_c = TPZCompMesh::Dimension(pTVar3);
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZCompMesh::ApproxSpace(pTVar3);
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(in_stack_fffffffffffffec0,dimension);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffe70);
  local_10 = *(int *)(in_RDI + 0xb4);
  if (local_10 < 1) {
    local_10 = 1;
  }
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZCompMesh::SetDefaultOrder(pTVar3,local_10);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
       ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffe58);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffe58);
    bVar2 = std::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f6313e);
    lVar1 = ppVar4->first;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f63166);
    if (lVar1 == (ppVar4->second).second) {
      pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
    }
    pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    TPZGeoMesh::ElementVec(pTVar5);
    ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    this_00 = *ppTVar6;
    TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
    pTVar9 = TPZCompMesh::CreateCompEl
                       ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                        ,in_stack_fffffffffffffe58);
    in_stack_ffffffffffffffc4 = (**(code **)(*(long *)this_00 + 0xf0))();
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + -1;
    if (pTVar9 == (TPZCompEl *)0x0) {
      local_130 = (long *)0x0;
    }
    else {
      local_130 = (long *)__dynamic_cast(pTVar9,&TPZCompEl::typeinfo,
                                         &TPZInterpolationSpace::typeinfo,0);
    }
    TPZMHMeshControl::SetSubdomain
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f6327e);
    lVar1 = (ppVar4->second).first;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f63294);
    if (lVar1 < (ppVar4->second).second) {
      (**(code **)(*local_130 + 0x2f8))(local_130,in_stack_ffffffffffffffc4,1);
      in_stack_ffffffffffffffb8 = local_130;
    }
    else {
      (**(code **)(*local_130 + 0x2f8))(local_130,in_stack_ffffffffffffffc4,0xffffffff);
      in_stack_ffffffffffffffb8 = local_130;
    }
    TPZMHMeshControl::SetSubdomain
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    TPZGeoEl::ResetReference(this_00);
    in_stack_ffffffffffffffb0 =
         std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
                   ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                    in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  }
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffe70);
  ellist = std::
           map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
           ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                    *)in_stack_fffffffffffffe58);
  local_18._M_node = ellist._M_node;
  while( true ) {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffe58);
    bVar2 = std::operator!=(&local_18,&local_60);
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1f633b7);
    local_68 = ppVar4->first;
    std::
    map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
    ::map((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
           *)0x1f633d4);
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)0x1f633eb);
    TPZMHMeshControl::ConnectedElements
              ((TPZMHMeshControl *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int64_t)in_stack_ffffffffffffffb8,
               (pair<long,_long> *)in_stack_ffffffffffffffb0._M_node,
               (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                *)ellist._M_node);
    pTVar5 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    TPZGeoMesh::ElementVec(pTVar5);
    ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_b0 = *ppTVar6;
    local_b4 = (**(code **)(*(long *)local_b0 + 0xf0))();
    local_b4 = local_b4 + -1;
    in_stack_fffffffffffffe80 = (TPZChunkVector<TPZGeoEl_*,_10> *)TPZGeoEl::Reference(local_b0);
    local_c0 = in_stack_fffffffffffffe80;
    if (in_stack_fffffffffffffe80 == (TPZChunkVector<TPZGeoEl_*,_10> *)0x0) {
      in_stack_fffffffffffffe78 = 0;
    }
    else {
      in_stack_fffffffffffffe78 =
           __dynamic_cast(in_stack_fffffffffffffe80,&TPZCompEl::typeinfo,
                          &TPZInterpolatedElement::typeinfo,0);
    }
    local_c8 = in_stack_fffffffffffffe78;
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
         ::begin((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                  *)in_stack_fffffffffffffe58);
    while( true ) {
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
           ::end((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                  *)in_stack_fffffffffffffe58);
      bVar2 = std::operator!=(&local_d0,&local_d8);
      if (!bVar2) break;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
                             *)0x1f6356c);
      local_e0 = &ppVar7->second;
      local_e8._M_node =
           (_List_node_base *)
           std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::begin
                     ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                      in_stack_fffffffffffffe58);
      while( true ) {
        local_f0._M_node =
             (_List_node_base *)
             std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::end
                       ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                        in_stack_fffffffffffffe58);
        bVar2 = std::operator!=(&local_e8,&local_f0);
        if (!bVar2) break;
        pTVar8 = std::_List_iterator<TPZCompElSide>::operator->
                           ((_List_iterator<TPZCompElSide> *)0x1f635cd);
        pTVar9 = TPZCompElSide::Element(pTVar8);
        if (pTVar9 == (TPZCompEl *)0x0) {
          in_stack_fffffffffffffe58 = (TPZGeoEl *)0x0;
        }
        else {
          in_stack_fffffffffffffe58 =
               (TPZGeoEl *)
               __dynamic_cast(pTVar9,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
        }
        in_stack_fffffffffffffe68 = in_stack_fffffffffffffe58;
        if (in_stack_fffffffffffffe58 == (TPZGeoEl *)0x0) {
          pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
        }
        pTVar8 = std::_List_iterator<TPZCompElSide>::operator->
                           ((_List_iterator<TPZCompElSide> *)0x1f63659);
        in_stack_fffffffffffffe64 = TPZCompElSide::Side(pTVar8);
        (**(code **)(*(long *)in_stack_fffffffffffffe58 + 0x350))
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe64,local_c8,local_b4);
        std::_List_iterator<TPZCompElSide>::operator++(&local_e8,0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
                    *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    }
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
               in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    std::
    map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
    ::~map((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
            *)0x1f636ec);
  }
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  (**(code **)(*(long *)pTVar3 + 0x60))();
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x1e8));
  TPZCompMesh::SetDimModel(pTVar3,local_c);
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateSkeleton()
{
    // comment this line or not to switch the type of skeleton elements
    int meshdim = fFluxMesh->Dimension();
    fFluxMesh->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    fGMesh->ResetReference();
    int order = fpOrderSkeleton;
    if (order <= 0) {
        order = 1;
    }
    // create the skeleton elements without applying the restraints of the elements of the subdomains
    fFluxMesh->SetDefaultOrder(order);
    std::map<int64_t, std::pair<int64_t, int64_t> >::iterator it = fInterfaces.begin();
    while (it != fInterfaces.end()) {
        int64_t elindex = it->first;

        if (elindex == it->second.second) {
            DebugStop();
            // boundary elements shouldn't be in fInterface map. they are removed from the map in method
            // TPZMHMixedMeshControl::AdjustBoundaryElements
        }
        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        // create an element to model the flux between subdomains
        TPZCompEl *cel = fFluxMesh->CreateCompEl(gel);
//        TPZCompEl *cel = fFluxMesh->ElementVec()[index];
        int Side = gel->NSides()-1;
        TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(cel);
        SetSubdomain(cel, -1);

        if (it->second.first < it->second.second) {
          // set the flux orientation depending on the relative value of the
          // element ids
          intel->SetSideOrient(Side, 1);
        } else {
          intel->SetSideOrient(Side, -1);
        }
        // this element will not be put in a subdomain
        SetSubdomain(cel, -1);
        gel->ResetReference();

        it++;
    }
    // Apply restraints to the element/sides and the skeleton
    fFluxMesh->LoadReferences();
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out("FluxBeforeInterfaces.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(fFluxMesh.operator->(), out);
    }
#endif
#ifdef PZDEBUG
    // verify if any connect is restrained
    {
        int64_t nconnects = fFluxMesh->NConnects();
        for (int64_t ic = 0; ic<nconnects; ic++) {
            TPZConnect &c = fFluxMesh->ConnectVec()[ic];
            if (c.HasDependency()) {
                std::cout << "Connect index " << ic << " Has dependency\n";
            }
        }
    }
#endif
    it = fInterfaces.begin();
    while (it != fInterfaces.end()) {
        // the index of the map of the interface data structure is the index of the geometric element
        int64_t elindex = it->first;

        // data structure containing the list of connected elements by subdomain
        std::map<int64_t,std::list<TPZCompElSide> > subels;
        // find the connected computational elements in function of the index of the geometric element
        ConnectedElements(elindex, it->second, subels);

#ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Interface elindex " << elindex << " left " << it->second.first << " right " << it->second.second << std::endl;
            sout << "Number of connected subdomains " << subels.size() << std::endl;
            for (std::map<int64_t,std::list<TPZCompElSide> >::iterator itlist = subels.begin(); itlist != subels.end(); itlist++)
            {
                sout << " SUBDOMAIN first " << itlist->first << "\n";
                std::list<TPZCompElSide> &lst = itlist->second;
                for (std::list<TPZCompElSide>::iterator its = lst.begin(); its != lst.end(); its++)
                {
                    sout << " GeoElSide " << its->Reference() << std::endl;
                }
            }
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif
        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        int side = gel->NSides()-1;
        TPZCompEl *cel = gel->Reference();
        // intel contains the flux skeleton element
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);

        for (std::map<int64_t,std::list<TPZCompElSide> >::iterator itlist = subels.begin(); itlist != subels.end(); itlist++) {
            std::list<TPZCompElSide> &lst = itlist->second;
            for (std::list<TPZCompElSide>::iterator its = lst.begin(); its != lst.end(); its++) {
                TPZInterpolatedElement *intelsub = dynamic_cast<TPZInterpolatedElement *>(its->Element());
                if (!intelsub) {
                    DebugStop();
                }
                intelsub->RestrainSide(its->Side(), intel, side);
            }
        }
        it++;
    }
    // this will renumber the connects that are now constrained
    fFluxMesh->ExpandSolution();
    fFluxMesh->SetDimModel(meshdim);
}